

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::print(Instance *this)

{
  uint uVar1;
  uint *puVar2;
  const_reference pvVar3;
  const_reference this_00;
  int local_20;
  int local_1c;
  int j;
  int q;
  int i;
  int p;
  Instance *this_local;
  
  printf("Instance:\n");
  q = 0;
  for (j = 0; j < this->m; j = j + 1) {
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->nopts,(long)j);
    uVar1 = *puVar2;
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->demands,(long)j);
    printf("i=%d (nopts: %d, demand: %d)\n",(ulong)(j + 1),(ulong)uVar1,(ulong)*puVar2);
    local_1c = 0;
    while( true ) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->nopts,(long)j);
      if (*pvVar3 <= local_1c) break;
      printf("  opt=%d: (",(ulong)(local_1c + 1));
      for (local_20 = 0; local_20 < this->ndims; local_20 = local_20 + 1) {
        if (local_20 != 0) {
          printf(", ");
        }
        this_00 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->items,(long)q);
        uVar1 = Item::operator[](this_00,local_20);
        printf("%d",(ulong)uVar1);
      }
      printf(")\n");
      q = q + 1;
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void Instance::print() const {
	printf("Instance:\n");
	int p = 0;
	for (int i = 0; i < m; i++) {
		printf("i=%d (nopts: %d, demand: %d)\n", i + 1, nopts[i], demands[i]);
		for (int q = 0; q < nopts[i]; q++) {
			printf("  opt=%d: (", q + 1);
			for (int j = 0; j < ndims; j++) {
				if (j) {
					printf(", ");
				}
				printf("%d", items[p][j]);
			}
			printf(")\n");
			p++;
		}
	}
}